

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O1

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  size_type sVar1;
  pointer pcVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  char *pcStack_88;
  size_type local_80;
  pointer local_78;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  undefined1 *puStack_58;
  undefined1 local_50 [32];
  
  sVar1 = (this->Directory)._M_string_length;
  if (sVar1 == 0) {
    local_a0._M_str = (this->Name)._M_dataplus._M_p;
    local_a0._M_len = (this->Name)._M_string_length;
    local_90 = 0xb;
    pcStack_88 = ".framework/";
    local_68 = (this->Suffix)._M_dataplus._M_p;
    local_70 = (this->Suffix)._M_string_length;
    views_01._M_len = 4;
    views_01._M_array = &local_a0;
    local_80 = local_a0._M_len;
    local_78 = local_a0._M_str;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views_01);
  }
  else {
    pcVar2 = (this->Directory)._M_dataplus._M_p;
    puStack_58 = local_50;
    local_60 = 1;
    local_50[0] = 0x2f;
    local_a0._M_str = (this->Name)._M_dataplus._M_p;
    local_a0._M_len = (this->Name)._M_string_length;
    local_90 = 0xb;
    pcStack_88 = ".framework/";
    local_68 = (this->Suffix)._M_dataplus._M_p;
    local_70 = (this->Suffix)._M_string_length;
    views._M_len = 4;
    views._M_array = &local_a0;
    local_80 = local_a0._M_len;
    local_78 = local_a0._M_str;
    cmCatViews_abi_cxx11_(&local_c0,views);
    local_90 = local_60;
    pcStack_88 = puStack_58;
    local_80 = local_c0._M_string_length;
    local_78 = local_c0._M_dataplus._M_p;
    views_00._M_len = 3;
    views_00._M_array = &local_a0;
    local_a0._M_len = sVar1;
    local_a0._M_str = pcVar2;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullPath() const
    {
      return this->Directory.empty()
        ? this->GetFullName()
        : cmStrCat(this->Directory, '/', this->GetFullName());
    }